

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O0

void __thiscall webfront::fs::File::~File(File *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  std::ifstream::~ifstream(&in_RDI[2].field_2);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

File(EncodedData auto t) : File(decltype(t)::data, decltype(t)::dataSize, decltype(t)::encoding) {}